

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::
unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::DiagGroup,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>>
::
unordered_flat_map<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>const*>
          (unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
           *this,pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>
                 *first,
          pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup> *last,
          size_type n,hasher *h,key_equal *pred,allocator_type *a)

{
  bool bVar1;
  uint uVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
  *in_R9;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup> *pos;
  locator loc;
  size_t pos0;
  size_t hash;
  raw_key_type *k;
  uint n_1;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos_1;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>
  *in_stack_fffffffffffffe08;
  raw_key_type *in_stack_fffffffffffffe10;
  raw_key_type *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>
  *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_160;
  long local_148;
  long local_140;
  long local_128;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>
  local_a0;
  size_t local_88;
  size_t local_80;
  raw_key_type *local_78;
  long local_70;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  raw_key_type *local_10;
  
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
              *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
             (hasher *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (key_equal *)in_stack_fffffffffffffdf8,(allocator_type *)0xa8642b);
  local_148 = in_RSI;
  local_140 = in_RDX;
  do {
    if (local_148 == local_140) {
      return;
    }
    local_128 = local_148;
    local_70 = local_148;
    local_78 = detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::DiagGroup>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>>
               ::
               key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>
                         ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>
                           *)0xa864e2);
    local_80 = detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::DiagGroup>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>>
               ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                           *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                          in_stack_fffffffffffffdf8);
    local_88 = detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                              (size_t)in_stack_fffffffffffffdf8);
    local_10 = local_78;
    local_20 = local_80;
    local_18 = local_88;
    detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_88);
    do {
      local_38 = detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = detail::foa::
                 table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                 ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                           *)0xa865c0);
      local_40 = local_40 + local_38;
      uVar2 = detail::foa::group15<boost::unordered::detail::foa::plain_integral>::match
                        ((group15<boost::unordered::detail::foa::plain_integral> *)
                         in_stack_fffffffffffffe08,
                         CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
      local_44 = uVar2;
      if (uVar2 != 0) {
        local_50 = detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                   ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                               *)0xa86615);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffe08 =
               (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>
                *)detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                          *)0xa86665);
          in_stack_fffffffffffffe10 = local_10;
          in_stack_fffffffffffffe18 =
               detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::DiagGroup>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>>
               ::
               key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>
                         ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>
                           *)0xa86693);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             CONCAT44(uVar2,in_stack_fffffffffffffe20),in_stack_fffffffffffffe18,
                             in_stack_fffffffffffffe10);
          if (bVar1) {
            detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>
            ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
            goto LAB_00a8679a;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      in_stack_fffffffffffffe07 =
           detail::foa::group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                     ((group15<boost::unordered::detail::foa::plain_integral> *)
                      CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                      (size_t)in_stack_fffffffffffffdf8);
      if ((bool)in_stack_fffffffffffffe07) {
        memset(&local_a0,0,0x18);
        detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>
        ::table_locator(&local_a0);
        goto LAB_00a8679a;
      }
      bVar1 = detail::foa::pow2_quadratic_prober::next(&local_30,*(size_t *)(in_RDI + 8));
    } while (bVar1);
    memset(&local_a0,0,0x18);
    detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>
    ::table_locator(&local_a0);
LAB_00a8679a:
    bVar1 = detail::foa::table_locator::operator_cast_to_bool((table_locator *)&local_a0);
    if (bVar1) {
      local_b0 = detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                 ::make_iterator((locator *)0xa867bc);
      local_b1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_160,&local_b0,&local_b1);
    }
    else if (*(ulong *)(in_RDI + 0x28) < *(ulong *)(in_RDI + 0x20)) {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::DiagGroup>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>>
      ::
      unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>const&>
                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                  *)CONCAT44(uVar2,in_stack_fffffffffffffe20),(size_t)in_stack_fffffffffffffe18,
                 (size_t)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_c8 = detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                 ::make_iterator((locator *)0xa8683e);
      local_e1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_160,&local_c8,local_e1);
    }
    else {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::DiagGroup>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>>>
      ::
      unchecked_emplace_with_rehash<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::DiagGroup>const&>
                (in_R9,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      local_f8 = detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>_>_>
                 ::make_iterator((locator *)0xa868a6);
      local_111[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::DiagGroup>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_160,&local_f8,local_111);
    }
    local_148 = local_148 + 0x48;
  } while( true );
}

Assistant:

unordered_flat_map(Iterator first, Iterator last, size_type n = 0, hasher const& h = hasher(),
                       key_equal const& pred = key_equal(),
                       allocator_type const& a = allocator_type()) :
        unordered_flat_map(n, h, pred, a) {
        this->insert(first, last);
    }